

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_hash.c
# Opt level: O2

void * ngx_hash_find_wc_head(ngx_hash_wildcard_t *hwc,u_char *name,size_t len)

{
  ulong uVar1;
  void *pvVar2;
  u_char *puVar3;
  ulong len_00;
  ngx_uint_t key;
  void *pvVar4;
  
  len_00 = 0;
  for (puVar3 = name; (uVar1 = len - len_00, uVar1 != 0 && (puVar3[len - 1] != '.'));
      puVar3 = puVar3 + -1) {
    len_00 = len_00 + 1;
  }
  key = 0;
  for (; uVar1 < len; uVar1 = uVar1 + 1) {
    key = (ulong)name[uVar1] + key * 0x1f;
  }
  pvVar2 = ngx_hash_find(&hwc->hash,key,puVar3 + len,len_00);
  if (pvVar2 == (void *)0x0) {
    pvVar4 = hwc->value;
  }
  else if (((ulong)pvVar2 & 2) == 0) {
    pvVar4 = (void *)0x0;
    if (((ulong)pvVar2 & 1) == 0) {
      pvVar4 = pvVar2;
    }
    if ((len != len_00) && (((ulong)pvVar2 & 1) != 0)) {
      pvVar4 = (void *)((ulong)pvVar2 & 0xfffffffffffffffc);
    }
  }
  else {
    if (len == len_00) {
      if (((ulong)pvVar2 & 1) != 0) {
        return (void *)0x0;
      }
    }
    else {
      pvVar4 = ngx_hash_find_wc_head
                         ((ngx_hash_wildcard_t *)((ulong)pvVar2 & 0xfffffffffffffffc),name,
                          ~len_00 + len);
      if (pvVar4 != (void *)0x0) {
        return pvVar4;
      }
    }
    pvVar4 = *(void **)(((ulong)pvVar2 & 0xfffffffffffffffc) + 0x10);
  }
  return pvVar4;
}

Assistant:

void *
ngx_hash_find_wc_head(ngx_hash_wildcard_t *hwc, u_char *name, size_t len)
{
    void        *value;
    ngx_uint_t   i, n, key;

#if 0
    ngx_log_error(NGX_LOG_ALERT, ngx_cycle->log, 0, "wch:\"%*s\"", len, name);
#endif

    n = len;

    while (n) {
        if (name[n - 1] == '.') {
            break;
        }

        n--;
    }

    key = 0;

    for (i = n; i < len; i++) {
        key = ngx_hash(key, name[i]);
    }

#if 0
    ngx_log_error(NGX_LOG_ALERT, ngx_cycle->log, 0, "key:\"%ui\"", key);
#endif

    value = ngx_hash_find(&hwc->hash, key, &name[n], len - n);

#if 0
    ngx_log_error(NGX_LOG_ALERT, ngx_cycle->log, 0, "value:\"%p\"", value);
#endif

    if (value) {

        /*
         * the 2 low bits of value have the special meaning:
         *     00 - value is data pointer for both "example.com"
         *          and "*.example.com";
         *     01 - value is data pointer for "*.example.com" only;
         *     10 - value is pointer to wildcard hash allowing
         *          both "example.com" and "*.example.com";
         *     11 - value is pointer to wildcard hash allowing
         *          "*.example.com" only.
         */

        if ((uintptr_t) value & 2) {

            if (n == 0) {

                /* "example.com" */

                if ((uintptr_t) value & 1) {
                    return NULL;
                }

                hwc = (ngx_hash_wildcard_t *)
                                          ((uintptr_t) value & (uintptr_t) ~3);
                return hwc->value;
            }

            hwc = (ngx_hash_wildcard_t *) ((uintptr_t) value & (uintptr_t) ~3);

            value = ngx_hash_find_wc_head(hwc, name, n - 1);

            if (value) {
                return value;
            }

            return hwc->value;
        }

        if ((uintptr_t) value & 1) {

            if (n == 0) {

                /* "example.com" */

                return NULL;
            }

            return (void *) ((uintptr_t) value & (uintptr_t) ~3);
        }

        return value;
    }

    return hwc->value;
}